

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
module_overview_csv_actions::module2(module_overview_csv_actions *this,string *module)

{
  if (this->first_module_ == true) {
    this->first_module_ = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  return;
}

Assistant:

void module2( std::string const & module )
    {
        if( first_module_ )
            first_module_ = false;
        else
            std::cout << " ";
        std::cout << module;
    }